

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::SectionInfo::SectionInfo
          (SectionInfo *this,SourceLineInfo *_lineInfo,string *_name,string *_description)

{
  std::__cxx11::string::string((string *)this,(string *)_name);
  std::__cxx11::string::string((string *)&this->description,(string *)_description);
  SourceLineInfo::SourceLineInfo(&this->lineInfo,_lineInfo);
  return;
}

Assistant:

SectionInfo::SectionInfo
        (   SourceLineInfo const& _lineInfo,
            std::string const& _name,
            std::string const& _description )
    :   name( _name ),
        description( _description ),
        lineInfo( _lineInfo )
    {}